

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionProxy::SetCrossSiteUndeferredFunctionType(FunctionProxy *this,ScriptFunctionType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  ParseableFunctionInfo *this_00;
  
  pFVar4 = (this->functionInfo).ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0075fafb;
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  if ((pFVar4->functionBodyImpl).ptr == this) {
LAB_0075fa86:
    if ((pFVar4->attributes & DeferredDeserialize) == None) goto LAB_0075fade;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_0075fafb;
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
    if ((pFVar4->functionBodyImpl).ptr != (FunctionProxy *)0x0) goto LAB_0075fa86;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x85c,"(HasParseableInfo())","HasParseableInfo()");
  if (!bVar2) {
LAB_0075fafb:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0075fade:
  this_00 = GetParseableFunctionInfo(this);
  ParseableFunctionInfo::SetCrossSiteUndeferredFunctionType(this_00,type);
  return;
}

Assistant:

void FunctionProxy::SetCrossSiteUndeferredFunctionType(ScriptFunctionType * type)
    {
        Assert(HasParseableInfo());
        GetParseableFunctionInfo()->SetCrossSiteUndeferredFunctionType(type);
    }